

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void AGSSock::Terminate(void)

{
  _Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this;
  
  this = pool;
  if (pool != (_Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)0x0) {
    AGSSockAPI::Thread::~Thread((Thread *)&pool[1]._M_single_bucket);
    AGSSockAPI::Beacon::~Beacon((Beacon *)&this[1]._M_rehash_policy._M_next_resize);
    pthread_mutex_destroy((pthread_mutex_t *)(this + 1));
    std::
    _Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(this);
  }
  operator_delete(this,0x90);
  pool = (_Hashtable<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          *)0x0;
  return;
}

Assistant:

void Terminate()
{
	// We assume that all managed objects will be disposed of at this point.
	// That means the pool is or soon will be empty thus the read loop stops.
	// Deleting the pool gives it two seconds to do it nicely or else just
	// kills it.
	
	delete pool;
	pool = nullptr;
}